

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

bool __thiscall cmdline::parser::exist(parser *this,string *name)

{
  int iVar1;
  size_type sVar2;
  cmdline_error *this_00;
  pointer ppVar3;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
  local_50;
  undefined1 local_45;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  key_type *local_18;
  string *name_local;
  parser *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
          ::count(&this->options,name);
  if (sVar2 == 0) {
    local_45 = 1;
    this_00 = (cmdline_error *)__cxa_allocate_exception(0x28);
    std::operator+(&local_38,"there is no flag: --",local_18);
    cmdline_error::cmdline_error(this_00,&local_38);
    local_45 = 0;
    __cxa_throw(this_00,&cmdline_error::typeinfo,cmdline_error::~cmdline_error);
  }
  local_50._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
       ::find(&this->options,local_18);
  ppVar3 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
           ::operator->(&local_50);
  iVar1 = (*ppVar3->second->_vptr_option_base[5])();
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool exist(const std::string
            &name) const {
                if (options.count(name) == 0) throw
                cmdline_error("there is no flag: --" + name);
                return options.find(name)->second->has_set();
            }